

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void PeleLM::Initialize_specific(void)

{
  unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
  uVar1;
  Factory<pele::physics::reactions::ReactorBase> FVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 uVar6;
  int i;
  int dir;
  long lVar7;
  byte bVar8;
  long lVar9;
  byte bVar10;
  Factory<pele::physics::reactions::ReactorBase> local_f8;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hi_bc_char;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lo_bc_char;
  Vector<int,_std::allocator<int>_> hi_bc;
  Vector<int,_std::allocator<int>_> lo_bc;
  ParmParse pplm;
  
  (anonymous_namespace)::num_deltaT_iters_MAX = 10;
  (anonymous_namespace)::deltaT_norm_max = 0x3ddb7cdfd9d7bdbb;
  (anonymous_namespace)::num_forkjoin_tasks = 1;
  (anonymous_namespace)::forkjoin_verbose = 0;
  std::__cxx11::string::string((string *)&lo_bc_char,"peleLM",(allocator *)&hi_bc_char);
  amrex::ParmParse::ParmParse(&pplm,(string *)&lo_bc_char);
  std::__cxx11::string::~string((string *)&lo_bc_char);
  amrex::ParmParse::query(&pplm,"speciesGroupSize",&nSpecGroup,0);
  amrex::ParmParse::query(&pplm,"num_forkjoin_tasks",&(anonymous_namespace)::num_forkjoin_tasks,0);
  amrex::ParmParse::query
            (&pplm,"forkjoin_verbose",(bool *)&(anonymous_namespace)::forkjoin_verbose,0);
  amrex::ParmParse::query
            (&pplm,"num_deltaT_iters_MAX",&(anonymous_namespace)::num_deltaT_iters_MAX,0);
  amrex::ParmParse::query
            (&pplm,"deltaT_norm_max",(double *)&(anonymous_namespace)::deltaT_norm_max,0);
  amrex::ParmParse::query(&pplm,"deltaT_verbose",&deltaT_verbose,0);
  amrex::ParmParse::query(&pplm,"deltaT_crashOnConvFail",&deltaT_crashOnConvFail,0);
  amrex::ParmParse::query(&pplm,"use_typ_vals_chem",&use_typ_vals_chem,0);
  amrex::ParmParse::query(&pplm,"harm_avg_cen2edge",&def_harm_avg_cen2edge,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&lo_bc_char.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,3,(allocator_type *)&hi_bc_char);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&hi_bc_char.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,3,(allocator_type *)&lo_bc);
  amrex::ParmParse::getarr
            (&pplm,"lo_bc",
             &lo_bc_char.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,0,3);
  amrex::ParmParse::getarr
            (&pplm,"hi_bc",
             &hi_bc_char.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,0,3);
  std::vector<int,_std::allocator<int>_>::vector
            (&lo_bc.super_vector<int,_std::allocator<int>_>,3,(allocator_type *)&hi_bc);
  std::vector<int,_std::allocator<int>_>::vector
            (&hi_bc.super_vector<int,_std::allocator<int>_>,3,(allocator_type *)&local_f8);
  lVar7 = 0;
  lVar9 = 0;
  bVar8 = 0;
  do {
    if (lVar7 == 0x60) {
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        NavierStokesBase::phys_bc.bc[lVar7] =
             lo_bc.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [lVar7];
        NavierStokesBase::phys_bc.bc[lVar7 + 3] =
             hi_bc.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [lVar7];
      }
      NavierStokesBase::read_geometry();
      lVar7 = **(long **)(DAT_006e0238 + -8);
      if (((*(char *)(lVar7 + 0x51) != '\0') || (*(char *)(lVar7 + 0x52) != '\0')) ||
         (*(char *)(lVar7 + 0x53) == '\x01')) {
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          if (*(char *)(**(long **)(DAT_006e0238 + -8) + 0x51 + lVar7) == '\x01') {
            if (lo_bc.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar7] != 0) {
              poVar5 = std::operator<<((ostream *)&std::cerr,
                                       "PeleLM::variableSetUp:periodic in direction ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar7);
              std::operator<<(poVar5," but low BC is not Interior\n");
              amrex::Abort_host("PeleLM::Initialize()");
            }
            if (hi_bc.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar7] != 0) {
              poVar5 = std::operator<<((ostream *)&std::cerr,
                                       "PeleLM::variableSetUp:periodic in direction ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar7);
              std::operator<<(poVar5," but high BC is not Interior\n");
              amrex::Abort_host("PeleLM::Initialize()");
            }
          }
        }
      }
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        if (*(char *)(**(long **)(DAT_006e0238 + -8) + 0x51 + lVar7) == '\0') {
          if (lo_bc.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar7] == 0) {
            poVar5 = std::operator<<((ostream *)&std::cerr,
                                     "PeleLM::variableSetUp:Interior bc in direction ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar7);
            std::operator<<(poVar5," but not defined as periodic\n");
            amrex::Abort_host("PeleLM::Initialize()");
          }
          if (hi_bc.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar7] == 0) {
            poVar5 = std::operator<<((ostream *)&std::cerr,
                                     "PeleLM::variableSetUp:Interior bc in direction ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar7);
            std::operator<<(poVar5," but not defined as periodic\n");
            amrex::Abort_host("PeleLM::Initialize()");
          }
        }
      }
      closed_chamber = (int)(~bVar8 & 1);
      dpdt_factor = 1.0;
      amrex::ParmParse::query(&pplm,"dpdt_factor",&dpdt_factor,0);
      bVar3 = amrex::ParmParse::contains(&pplm,"chem_integrator");
      if (!bVar3) {
        amrex::Abort_host("  peleLM.chem_integrator need to be specified");
      }
      amrex::ParmParse::get(&pplm,"chem_integrator",&chem_integrator_abi_cxx11_,0);
      pele::physics::Factory<pele::physics::reactions::ReactorBase>::create
                (&local_f8,&chem_integrator_abi_cxx11_);
      FVar2._vptr_Factory = local_f8._vptr_Factory;
      uVar1 = m_reactor;
      local_f8._vptr_Factory = (_func_int **)0x0;
      m_reactor._M_t.
      super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
      .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>,_true,_true>
            )(__uniq_ptr_data<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>,_true,_true>
              )FVar2._vptr_Factory;
      if (((__uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
            )uVar1._M_t.
             super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
             .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
            )0x0) &&
         ((**(code **)(*(long *)uVar1._M_t.
                                super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                                .
                                super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>
                                ._M_head_impl + 8))(), local_f8._vptr_Factory != (_func_int **)0x0))
      {
        (**(code **)(*local_f8._vptr_Factory + 8))();
      }
      (**(code **)(*(long *)m_reactor._M_t.
                            super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                            .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>.
                            _M_head_impl + 0x10))
                (m_reactor._M_t.
                 super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                 .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>._M_head_impl
                 ,2,1);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&hi_bc);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&lo_bc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&hi_bc_char.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lo_bc_char.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&pplm);
      return;
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((long)&((lo_bc_char.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar7));
    if (iVar4 == 0) {
      uVar6 = 0;
      bVar10 = bVar8;
LAB_0017fb30:
      bVar8 = bVar10;
      *(undefined4 *)
       ((long)lo_bc.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       + lVar9) = uVar6;
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((lo_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      bVar10 = 1;
      if (iVar4 == 0) {
        uVar6 = 1;
        goto LAB_0017fb30;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((lo_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      uVar6 = 2;
      if (iVar4 == 0) goto LAB_0017fb30;
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((lo_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar4 == 0) {
        uVar6 = 3;
        bVar10 = bVar8;
        goto LAB_0017fb30;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((lo_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar4 == 0) {
        uVar6 = 4;
        bVar10 = bVar8;
        goto LAB_0017fb30;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((lo_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar4 == 0) {
        uVar6 = 5;
        bVar10 = bVar8;
        goto LAB_0017fb30;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((lo_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar4 == 0) {
        uVar6 = 6;
        bVar10 = bVar8;
        goto LAB_0017fb30;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((lo_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar4 == 0) {
        uVar6 = 7;
        bVar10 = bVar8;
        goto LAB_0017fb30;
      }
      amrex::Abort_host(
                       "Wrong boundary condition word in lo_bc, please use: Interior, Inflow, Outflow, Symmetry, SlipWallAdiab, NoSlipWallAdiab, SlipWallIsotherm, NoSlipWallIsotherm"
                       );
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((long)&((hi_bc_char.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar7));
    if (iVar4 == 0) {
      uVar6 = 0;
      bVar10 = bVar8;
LAB_0017fc33:
      *(undefined4 *)
       ((long)hi_bc.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       + lVar9) = uVar6;
      bVar8 = bVar10;
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((hi_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      bVar10 = 1;
      if (iVar4 == 0) {
        uVar6 = 1;
        goto LAB_0017fc33;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((hi_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      uVar6 = 2;
      if (iVar4 == 0) goto LAB_0017fc33;
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((hi_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar4 == 0) {
        uVar6 = 3;
        bVar10 = bVar8;
        goto LAB_0017fc33;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((hi_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar4 == 0) {
        uVar6 = 4;
        bVar10 = bVar8;
        goto LAB_0017fc33;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((hi_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar4 == 0) {
        uVar6 = 5;
        bVar10 = bVar8;
        goto LAB_0017fc33;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((hi_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar4 == 0) {
        uVar6 = 6;
        bVar10 = bVar8;
        goto LAB_0017fc33;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((hi_bc_char.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar4 == 0) {
        uVar6 = 7;
        bVar10 = bVar8;
        goto LAB_0017fc33;
      }
      amrex::Abort_host(
                       "Wrong boundary condition word in hi_bc, please use: Interior, UserBC, Symmetry, SlipWall, NoSlipWall"
                       );
    }
    lVar9 = lVar9 + 4;
    lVar7 = lVar7 + 0x20;
  } while( true );
}

Assistant:

void
PeleLM::Initialize_specific ()
{

    num_deltaT_iters_MAX    = 10;
    deltaT_norm_max         = 1.e-10;
    num_forkjoin_tasks      = 1;
    forkjoin_verbose        = false;

    ParmParse pplm("peleLM");

    // Number of species in group for multi-component solves
    pplm.query("speciesGroupSize",nSpecGroup);

    pplm.query("num_forkjoin_tasks",num_forkjoin_tasks);
    pplm.query("forkjoin_verbose",forkjoin_verbose);
    pplm.query("num_deltaT_iters_MAX",num_deltaT_iters_MAX);
    pplm.query("deltaT_norm_max",deltaT_norm_max);
    pplm.query("deltaT_verbose",deltaT_verbose);
    pplm.query("deltaT_crashOnConvFail",deltaT_crashOnConvFail);

    pplm.query("use_typ_vals_chem",use_typ_vals_chem);
    pplm.query("harm_avg_cen2edge", def_harm_avg_cen2edge);

    // Get boundary conditions
    Vector<std::string> lo_bc_char(AMREX_SPACEDIM);
    Vector<std::string> hi_bc_char(AMREX_SPACEDIM);
    pplm.getarr("lo_bc",lo_bc_char,0,AMREX_SPACEDIM);
    pplm.getarr("hi_bc",hi_bc_char,0,AMREX_SPACEDIM);


    Vector<int> lo_bc(AMREX_SPACEDIM), hi_bc(AMREX_SPACEDIM);
    bool flag_closed_chamber = false;
    for (int dir = 0; dir<AMREX_SPACEDIM; dir++){
      if (!lo_bc_char[dir].compare("Interior")){
        lo_bc[dir] = 0;
      } else if (!lo_bc_char[dir].compare("Inflow")){
        lo_bc[dir] = 1;
        flag_closed_chamber = true;
      } else if (!lo_bc_char[dir].compare("Outflow")){
        lo_bc[dir] = 2;
        flag_closed_chamber = true;
      } else if (!lo_bc_char[dir].compare("Symmetry")){
        lo_bc[dir] = 3;
      } else if (!lo_bc_char[dir].compare("SlipWallAdiab")){
        lo_bc[dir] = 4;
      } else if (!lo_bc_char[dir].compare("NoSlipWallAdiab")){
        lo_bc[dir] = 5;
      } else if (!lo_bc_char[dir].compare("SlipWallIsotherm")){
        lo_bc[dir] = 6;
      } else if (!lo_bc_char[dir].compare("NoSlipWallIsotherm")){
        lo_bc[dir] = 7;
      } else {
        amrex::Abort("Wrong boundary condition word in lo_bc, please use: Interior, Inflow, Outflow, "
                     "Symmetry, SlipWallAdiab, NoSlipWallAdiab, SlipWallIsotherm, NoSlipWallIsotherm");
      }

      if (!hi_bc_char[dir].compare("Interior")){
        hi_bc[dir] = 0;
      } else if (!hi_bc_char[dir].compare("Inflow")){
        hi_bc[dir] = 1;
        flag_closed_chamber = true;
      } else if (!hi_bc_char[dir].compare("Outflow")){
        hi_bc[dir] = 2;
        flag_closed_chamber = true;
      } else if (!hi_bc_char[dir].compare("Symmetry")){
        hi_bc[dir] = 3;
      } else if (!hi_bc_char[dir].compare("SlipWallAdiab")){
        hi_bc[dir] = 4;
      } else if (!hi_bc_char[dir].compare("NoSlipWallAdiab")){
        hi_bc[dir] = 5;
      } else if (!hi_bc_char[dir].compare("SlipWallIsotherm")){
        hi_bc[dir] = 6;
      } else if (!hi_bc_char[dir].compare("NoSlipWallIsotherm")){
        hi_bc[dir] = 7;
      } else {
        amrex::Abort("Wrong boundary condition word in hi_bc, please use: Interior, UserBC, Symmetry, SlipWall, NoSlipWall");
      }
    }

    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        phys_bc.setLo(i,lo_bc[i]);
        phys_bc.setHi(i,hi_bc[i]);
    }

    read_geometry();
    //
    // Check phys_bc against possible periodic geometry
    // if periodic, must have internal BC marked.
    //
    if (DefaultGeometry().isAnyPeriodic())
    {
        //
        // Do idiot check.  Periodic means interior in those directions.
        //
        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
        {
            if (DefaultGeometry().isPeriodic(dir))
            {
                if (lo_bc[dir] != Interior)
                {
                    std::cerr << "PeleLM::variableSetUp:periodic in direction "
                              << dir
                              << " but low BC is not Interior\n";
                    amrex::Abort("PeleLM::Initialize()");
                }
                if (hi_bc[dir] != Interior)
                {
                    std::cerr << "PeleLM::variableSetUp:periodic in direction "
                              << dir
                              << " but high BC is not Interior\n";
                    amrex::Abort("PeleLM::Initialize()");
                }
            }
        }
    }

    {
        //
        // Do idiot check.  If not periodic, should be no interior.
        //
        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
        {
            if (!DefaultGeometry().isPeriodic(dir))
            {
              if (lo_bc[dir] == Interior)
              {
                  std::cerr << "PeleLM::variableSetUp:Interior bc in direction "
                            << dir
                            << " but not defined as periodic\n";
                  amrex::Abort("PeleLM::Initialize()");
              }
              if (hi_bc[dir] == Interior)
              {
                  std::cerr << "PeleLM::variableSetUp:Interior bc in direction "
                            << dir
                            << " but not defined as periodic\n";
                  amrex::Abort("PeleLM::Initialize()");
              }
            }
        }
    }

   PeleLM::closed_chamber  = 1;
   if (flag_closed_chamber){
      PeleLM::closed_chamber  = 0;
   }

   PeleLM::dpdt_factor = 1.0;
   pplm.query("dpdt_factor",dpdt_factor);

   // Initialize reactor: TODO might do a per level ?
   if (!pplm.contains("chem_integrator")) {
      Abort("  peleLM.chem_integrator need to be specified");
   }
   pplm.get("chem_integrator",chem_integrator);
   m_reactor = pele::physics::reactions::ReactorBase::create(chem_integrator);
   const int nCell = 1;
   const int reactType = 2;
   m_reactor->init(reactType, nCell);
}